

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void __thiscall acto::core::runtime_t::deconstruct_object(runtime_t *this,object_t *obj)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  byte bVar2;
  waiter_t *pwVar3;
  __int_type_conflict _Var4;
  int iVar5;
  size_type sVar6;
  waiter_t *pwVar7;
  object_t *poVar8;
  object_t *local_20;
  
  local_20 = obj;
  if (obj == (object_t *)0x0) {
    __assert_fail("obj",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0x78,"void acto::core::runtime_t::deconstruct_object(object_t *const)");
  }
  __mutex = &obj->cs;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  poVar8 = local_20;
  if (iVar5 == 0) {
    bVar2 = obj->field_0x60;
    obj->field_0x60 = bVar2 | 4;
    if ((bVar2 & 8) != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    if (obj->impl != (actor *)0x0) {
      LOCK();
      (obj->references).super___atomic_base<unsigned_long>._M_i =
           (obj->references).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      if (local_20->impl != (actor *)0x0) {
        (*local_20->impl->_vptr_actor[1])();
      }
      poVar8->impl = (actor *)0x0;
      pwVar7 = poVar8->waiters;
      if (poVar8->waiters != (waiter_t *)0x0) {
        while (pwVar7 != (waiter_t *)0x0) {
          pwVar3 = (pwVar7->super_node<acto::core::object_t::waiter_t>).next;
          event::signaled(&pwVar7->on_deleted);
          pwVar7 = pwVar3;
        }
        local_20->waiters = (waiter_t *)0x0;
        poVar8 = local_20;
      }
      LOCK();
      (poVar8->references).super___atomic_base<unsigned_long>._M_i =
           (poVar8->references).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      obj = local_20;
    }
    poVar8 = local_20;
    if (obj->thread != (worker_t *)0x0) {
      LOCK();
      paVar1 = &(this->workers_).reserved;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      worker_t::wakeup(local_20->thread);
      poVar8->thread = (worker_t *)0x0;
      obj = poVar8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((obj->field_0x60 & 1) == 0) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
      if (iVar5 != 0) goto LAB_00163e0b;
      sVar6 = std::
              _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(&(this->actors_)._M_h,&local_20);
      if ((sVar6 != 0) && ((this->actors_)._M_h._M_element_count == 0)) {
        event::signaled(&this->no_actors_event_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      obj = local_20;
    }
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&obj->cs);
    if (iVar5 == 0) {
      _Var4 = (local_20->references).super___atomic_base<unsigned_long>._M_i;
      pthread_mutex_unlock((pthread_mutex_t *)&obj->cs);
      if (_Var4 == 0) {
        operator_delete(local_20,0x68);
      }
      return;
    }
  }
LAB_00163e0b:
  std::__throw_system_error(iVar5);
}

Assistant:

void runtime_t::deconstruct_object(object_t* const obj) {
  assert(obj);

  {
    std::lock_guard<std::mutex> g(obj->cs);

    obj->deleting = true;
    // The object still has some messages in the mailbox.
    if (obj->scheduled) {
      return;
    }
    //
    if (obj->impl) {
      // Take temporary reference to the object to avoid calling the decontruct
      // function during deleteing the object's body.
      obj->references++;

      delete obj->impl, obj->impl = nullptr;

      if (obj->waiters) {
        for (object_t::waiter_t* it = obj->waiters; it != nullptr;) {
          // Make the event signaled will lead to destruction of the list node.
          // So retrieve pointer to the next node beforehand.
          object_t::waiter_t* next = it->next;
          it->on_deleted.signaled();
          it = next;
        }

        obj->waiters = nullptr;
      }

      obj->references--;
    }
    // The didicated thread will place itself into shared pool.
    if (obj->thread) {
      --workers_.reserved;
      obj->thread->wakeup();
      obj->thread = nullptr;
    }
  }

  const bool is_binded = obj->binded;

  // Remove object from the global registry.
  if (!is_binded) {
    std::lock_guard<std::mutex> g(mutex_);

    if (actors_.erase(obj)) {
      if (actors_.empty()) {
        no_actors_event_.signaled();
      }
    }
  }

  {
    std::lock_guard g(obj->cs);
    // Cannot delete the object if there are still some references to it.
    if (obj->references) {
      return;
    }
  }

  // There are no more references to the object,
  // so delete it.
  delete obj;
}